

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O0

void __thiscall
F2DDrawer::AddDim(F2DDrawer *this,PalEntry color,float damount,int x1,int y1,int w,int h)

{
  FSimpleVertex *this_00;
  FSimpleVertex *ptr;
  undefined4 local_38;
  DataGeneric dg;
  int h_local;
  int w_local;
  int y1_local;
  int x1_local;
  float damount_local;
  F2DDrawer *this_local;
  PalEntry color_local;
  
  this_local._4_4_ =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       CONCAT13((char)(int)(damount * 255.0),color.field_0._0_3_);
  dg.mVertIndex = h;
  dg.mVertCount = w;
  std::swap<unsigned_char>((uchar *)((long)&this_local + 6),(uchar *)((long)&this_local + 4));
  ptr._4_4_ = 1;
  local_38 = 0x10;
  dg.mLen = 4;
  dg.mType = TArray<FSimpleVertex,_FSimpleVertex>::Reserve(&this->mVertices,4);
  this_00 = TArray<FSimpleVertex,_FSimpleVertex>::operator[](&this->mVertices,(long)(int)dg.mType);
  FSimpleVertex::Set(this_00,(float)x1,(float)y1,0.0,0.0,0.0,(PalEntry)this_local._4_4_);
  FSimpleVertex::Set(this_00 + 1,(float)x1,(float)(y1 + dg.mVertIndex),0.0,0.0,0.0,
                     (PalEntry)this_local._4_4_);
  FSimpleVertex::Set(this_00 + 2,(float)(x1 + dg.mVertCount),(float)(y1 + dg.mVertIndex),0.0,0.0,0.0
                     ,(PalEntry)this_local._4_4_);
  FSimpleVertex::Set(this_00 + 3,(float)(x1 + dg.mVertCount),(float)y1,0.0,0.0,0.0,
                     (PalEntry)this_local._4_4_);
  AddData(this,(DataGeneric *)((long)&ptr + 4));
  return;
}

Assistant:

void F2DDrawer::AddDim(PalEntry color, float damount, int x1, int y1, int w, int h)
{
	color.a = uint8_t(damount * 255);
	std::swap(color.r, color.b);

	DataGeneric dg;

	dg.mType = DrawTypeDim;
	dg.mLen = (sizeof(dg) + 7) & ~7;
	dg.mVertCount = 4;
	dg.mVertIndex = (int)mVertices.Reserve(4);
	FSimpleVertex *ptr = &mVertices[dg.mVertIndex];
	ptr->Set(x1, y1, 0, 0, 0, color); ptr++;
	ptr->Set(x1, y1 + h, 0, 0, 0, color); ptr++;
	ptr->Set(x1 + w, y1 + h, 0, 0, 0, color); ptr++;
	ptr->Set(x1 + w, y1, 0, 0, 0, color); ptr++;
	AddData(&dg);
}